

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_elements_transaction.cpp
# Opt level: O0

ConfidentialTransactionController * __thiscall
cfd::api::ElementsTransactionApi::UpdateWitnessStack
          (ElementsTransactionApi *this,string *tx_hex,Txid *txid,uint32_t vout,
          SignParameter *update_sign_param,uint32_t stack_index)

{
  ConfidentialTransactionController *in_RDI;
  SignParameter *in_stack_00000018;
  uint32_t in_stack_00000024;
  Txid *in_stack_00000028;
  string *in_stack_00000030;
  function<cfd::ConfidentialTransactionController_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_00000038;
  uint32_t in_stack_00000050;
  
  std::function<cfd::ConfidentialTransactionController(std::__cxx11::string_const&)>::
  function<cfd::ConfidentialTransactionController(&)(std::__cxx11::string_const&),void>
            ((function<cfd::ConfidentialTransactionController_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_RDI,
             (_func_ConfidentialTransactionController_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
              *)in_RDI);
  TransactionApiBase::UpdateWitnessStack<cfd::ConfidentialTransactionController>
            (in_stack_00000038,in_stack_00000030,in_stack_00000028,in_stack_00000024,
             in_stack_00000018,in_stack_00000050);
  std::
  function<cfd::ConfidentialTransactionController_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<cfd::ConfidentialTransactionController_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x41dbdf);
  return in_RDI;
}

Assistant:

ConfidentialTransactionController ElementsTransactionApi::UpdateWitnessStack(
    const std::string& tx_hex, const Txid& txid, uint32_t vout,
    const SignParameter& update_sign_param, uint32_t stack_index) const {
  return TransactionApiBase::UpdateWitnessStack<
      ConfidentialTransactionController>(
      cfd::api::CreateController, tx_hex, txid, vout, update_sign_param,
      stack_index);
}